

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

bool __thiscall cmCTestTestHandler::ComputeTestList(cmCTestTestHandler *this)

{
  byte bVar1;
  pointer pcVar2;
  pointer piVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  size_t numTests;
  iterator __begin1;
  pointer pcVar8;
  iterator __end1;
  cmCTestTestProperties *tp_1;
  long lVar9;
  int cnt;
  ListOfTests *__range1;
  ListOfTests finalList;
  string last_directory;
  int local_78;
  int local_74;
  ListOfTests *local_70;
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  local_68;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::clear(&this->TestList);
  bVar5 = GetListOfTests(this);
  if (bVar5) {
    if (this->RerunFailed == true) {
      ComputeTestListForRerunFailed(this);
    }
    else {
      pcVar8 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = (long)pcVar2 - (long)pcVar8;
      uVar7 = 0;
      local_70 = &this->TestList;
      for (; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1) {
        CheckLabelFilter(this,pcVar8);
        uVar7 = uVar7 + pcVar8->IsInBasedOnREOptions;
      }
      if (this->UseUnion == false) {
        numTests = (size_t)uVar7;
      }
      else {
        numTests = (size_t)(int)(lVar9 / 0x300);
      }
      ExpandTestsToRunInformation(this,numTests);
      local_78 = 0;
      local_74 = 0;
      local_50 = local_40;
      local_48 = 0;
      local_40[0] = 0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      pcVar2 = (this->TestList).
               super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pcVar8 = (this->TestList).
                    super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start; pcVar8 != pcVar2; pcVar8 = pcVar8 + 1
          ) {
        local_78 = local_78 + 1;
        bVar1 = pcVar8->IsInBasedOnREOptions;
        if ((bool)bVar1 == true) {
          local_74 = local_74 + 1;
        }
        piVar3 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->TestsToRun).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (this->UseUnion == true) {
          if ((piVar3 != piVar4) &&
             (bVar6 = ::cm::contains<std::vector<int,_std::allocator<int>_>,_int,_0>
                                (&this->TestsToRun,&local_78), !bVar6)) {
            bVar1 = pcVar8->IsInBasedOnREOptions;
            goto joined_r0x0015cc3a;
          }
LAB_0015cc3c:
          pcVar8->Index = local_78;
          std::
          vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
          ::push_back(&local_68,pcVar8);
        }
        else if (piVar3 == piVar4) {
joined_r0x0015cc3a:
          if (bVar1 != 0) goto LAB_0015cc3c;
        }
        else {
          bVar6 = ::cm::contains<std::vector<int,_std::allocator<int>_>,_int,_0>
                            (&this->TestsToRun,&local_74);
          if (bVar6) {
            bVar1 = pcVar8->IsInBasedOnREOptions & 1;
            goto joined_r0x0015cc3a;
          }
        }
      }
      UpdateForFixtures(this,&local_68);
      this->TotalNumberOfTests =
           ((long)(this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->TestList).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x300;
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::operator=(local_70,&local_68);
      UpdateMaxTestNameWidth(this);
      std::
      vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
      ::~vector(&local_68);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return bVar5;
}

Assistant:

bool cmCTestTestHandler::ComputeTestList()
{
  this->TestList.clear(); // clear list of test
  if (!this->GetListOfTests()) {
    return false;
  }

  if (this->RerunFailed) {
    this->ComputeTestListForRerunFailed();
    return true;
  }

  cmCTestTestHandler::ListOfTests::size_type tmsize = this->TestList.size();
  // how many tests are in based on RegExp?
  int inREcnt = 0;
  for (cmCTestTestProperties& tp : this->TestList) {
    this->CheckLabelFilter(tp);
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }
  }
  // expand the test list based on the union flag
  if (this->UseUnion) {
    this->ExpandTestsToRunInformation(static_cast<int>(tmsize));
  } else {
    this->ExpandTestsToRunInformation(inREcnt);
  }
  // Now create a final list of tests to run
  int cnt = 0;
  inREcnt = 0;
  std::string last_directory;
  ListOfTests finalList;
  for (cmCTestTestProperties& tp : this->TestList) {
    cnt++;
    if (tp.IsInBasedOnREOptions) {
      inREcnt++;
    }

    if (this->UseUnion) {
      // if it is not in the list and not in the regexp then skip
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, cnt)) &&
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    } else {
      // is this test in the list of tests to run? If not then skip it
      if ((!this->TestsToRun.empty() &&
           !cm::contains(this->TestsToRun, inREcnt)) ||
          !tp.IsInBasedOnREOptions) {
        continue;
      }
    }
    tp.Index = cnt; // save the index into the test list for this test
    finalList.push_back(tp);
  }

  this->UpdateForFixtures(finalList);

  // Save the total number of tests before exclusions
  this->TotalNumberOfTests = this->TestList.size();
  // Set the TestList to the final list of all test
  this->TestList = finalList;

  this->UpdateMaxTestNameWidth();
  return true;
}